

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_fwd.hpp
# Opt level: O2

region * __thiscall
toml::detail::syntax::key::scan(region *__return_storage_ptr__,key *this,location *loc)

{
  either::scan(__return_storage_ptr__,&this->scanner_,loc);
  return __return_storage_ptr__;
}

Assistant:

region scan(location& loc) const override
    {
        return scanner_.scan(loc);
    }